

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::SeparatorEx(ImGuiSeparatorFlags flags)

{
  float fVar1;
  ImGuiWindow *pIVar2;
  ImGuiTable *pIVar3;
  ImGuiTableColumn *pIVar4;
  ImDrawList *pIVar5;
  ImGuiContext *pIVar6;
  bool bVar7;
  bool bVar8;
  ImU32 IVar9;
  long lVar10;
  ImGuiOldColumns *pIVar11;
  ImVec2 local_58;
  float local_50;
  float local_4c;
  ImRect bb;
  ImVec2 local_38;
  
  pIVar6 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  if (pIVar2->SkipItems == false) {
    if ((flags & 2U) == 0) {
      if ((flags & 1U) != 0) {
        fVar1 = (pIVar2->Pos).x;
        lVar10 = (long)(pIVar6->GroupStack).Size;
        bb.Min.x = fVar1;
        if ((0 < lVar10) && ((pIVar6->GroupStack).Data[lVar10 + -1].WindowID == pIVar2->ID)) {
          bb.Min.x = (pIVar2->DC).Indent.x + fVar1;
        }
        pIVar3 = pIVar6->CurrentTable;
        if (pIVar3 == (ImGuiTable *)0x0) {
          bb.Max.x = fVar1 + (pIVar2->Size).x;
        }
        else {
          pIVar4 = (pIVar3->Columns).Data;
          bb.Min.x = pIVar4[pIVar3->CurrentColumn].MinX;
          bb.Max.x = pIVar4[pIVar3->CurrentColumn].MaxX;
        }
        bVar7 = true;
        if (((flags & 4U) == 0) ||
           (pIVar11 = (pIVar2->DC).CurrentColumns, pIVar11 == (ImGuiOldColumns *)0x0)) {
          pIVar11 = (ImGuiOldColumns *)0x0;
        }
        else {
          local_50 = bb.Min.x;
          local_4c = bb.Max.x;
          PushColumnsBackground();
          bVar7 = false;
          bb.Max.x = local_4c;
          bb.Min.x = local_50;
        }
        bb.Min.y = (pIVar2->DC).CursorPos.y;
        bb.Max.y = bb.Min.y + 1.0;
        local_58.x = 0.0;
        local_58.y = 0.0;
        ItemSize(&local_58,-1.0);
        bVar8 = ItemAdd(&bb,0,(ImRect *)0x0,0);
        if (bVar8) {
          pIVar5 = pIVar2->DrawList;
          local_58.y = bb.Min.y;
          local_58.x = bb.Max.x;
          IVar9 = GetColorU32(0x1b,1.0);
          ImDrawList::AddLine(pIVar5,&bb.Min,&local_58,IVar9,1.0);
          if (pIVar6->LogEnabled == true) {
            LogRenderedText(&bb.Min,"--------------------------------\n",(char *)0x0);
          }
        }
        if (!bVar7) {
          PopColumnsBackground();
          pIVar11->LineMinY = (pIVar2->DC).CursorPos.y;
        }
      }
    }
    else {
      bb.Min.x = (pIVar2->DC).CursorPos.x;
      bb.Min.y = (pIVar2->DC).CursorPos.y;
      bb.Max.x = bb.Min.x + 1.0;
      bb.Max.y = (pIVar2->DC).CurrLineSize.y + bb.Min.y;
      local_58.x = 0.0;
      local_58.y = 0.0;
      ItemSize(&local_58,-1.0);
      bVar7 = ItemAdd(&bb,0,(ImRect *)0x0,0);
      if (bVar7) {
        pIVar5 = pIVar2->DrawList;
        local_58.y = bb.Min.y;
        local_58.x = bb.Min.x;
        local_38.x = bb.Min.x;
        local_38.y = bb.Max.y;
        IVar9 = GetColorU32(0x1b,1.0);
        ImDrawList::AddLine(pIVar5,&local_58,&local_38,IVar9,1.0);
        if (pIVar6->LogEnabled == true) {
          LogText(" |");
        }
      }
    }
  }
  return;
}

Assistant:

bool ImGui::DragFloatRange2(const char* label, float* v_current_min, float* v_current_max, float v_speed, float v_min, float v_max, const char* format, const char* format_max, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    float min_min = (v_min >= v_max) ? -FLT_MAX : v_min;
    float min_max = (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max);
    ImGuiSliderFlags min_flags = flags | ((min_min == min_max) ? ImGuiSliderFlags_ReadOnly : 0);
    bool value_changed = DragScalar("##min", ImGuiDataType_Float, v_current_min, v_speed, &min_min, &min_max, format, min_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    float max_min = (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min);
    float max_max = (v_min >= v_max) ? FLT_MAX : v_max;
    ImGuiSliderFlags max_flags = flags | ((max_min == max_max) ? ImGuiSliderFlags_ReadOnly : 0);
    value_changed |= DragScalar("##max", ImGuiDataType_Float, v_current_max, v_speed, &max_min, &max_max, format_max ? format_max : format, max_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();

    return value_changed;
}